

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,bool value)

{
  format_specs *spec;
  size_t in_RCX;
  
  spec = this->specs_;
  if ((spec == (format_specs *)0x0) || (spec->type == '\0')) {
    write(this,(uint)value,spec,in_RCX);
  }
  else {
    write_int<int>(this,(uint)value,spec);
  }
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(bool value) {
    if (specs_ && specs_->type) return (*this)(value ? 1 : 0);
    write(value != 0);
    return out_;
  }